

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_verify(secp256k1_fe *a)

{
  bool bVar1;
  undefined4 extraout_EAX;
  int iVar2;
  long lVar3;
  secp256k1_fe *r;
  secp256k1_fe *psVar4;
  undefined1 auVar5 [16];
  int iStack_44;
  uchar auStack_40 [32];
  secp256k1_fe *psStack_20;
  
  r = a;
  secp256k1_fe_verify_magnitude(a,0x20);
  if ((uint)a->normalized < 2) {
    if (a->normalized == 0) {
LAB_0012c75c:
      lVar3 = (long)a->magnitude * 2;
      bVar1 = false;
    }
    else {
      r = a;
      secp256k1_fe_verify_magnitude(a,1);
      if (a->normalized == 0) goto LAB_0012c75c;
      lVar3 = 1;
      bVar1 = true;
    }
    psVar4 = (secp256k1_fe *)((lVar3 << 0x34) - lVar3);
    if (psVar4 < (secp256k1_fe *)a->n[0]) goto LAB_0012c7e6;
    if (psVar4 < (secp256k1_fe *)a->n[1]) goto LAB_0012c7eb;
    r = (secp256k1_fe *)a->n[2];
    if (psVar4 < r) goto LAB_0012c7f0;
    if (psVar4 < (secp256k1_fe *)a->n[3]) goto LAB_0012c7f5;
    if (a->n[4] <= (ulong)((lVar3 << 0x30) - lVar3)) {
      if (((!bVar1 || a->n[4] != 0xffffffffffff) ||
          ((secp256k1_fe *)a->n[0] < (secp256k1_fe *)0xffffefffffc2f)) ||
         (r = (secp256k1_fe *)((ulong)r & (ulong)a->n[1] & (ulong)a->n[3]),
         r != (secp256k1_fe *)0xfffffffffffff)) {
        return;
      }
      goto LAB_0012c7ff;
    }
  }
  else {
    secp256k1_fe_verify_cold_7();
LAB_0012c7e6:
    secp256k1_fe_verify_cold_6();
LAB_0012c7eb:
    secp256k1_fe_verify_cold_5();
LAB_0012c7f0:
    secp256k1_fe_verify_cold_4();
LAB_0012c7f5:
    secp256k1_fe_verify_cold_3();
  }
  secp256k1_fe_verify_cold_2();
LAB_0012c7ff:
  secp256k1_fe_verify_cold_1();
  psStack_20 = a;
  do {
    do {
      iStack_44 = 0;
      testrand256(auStack_40);
      secp256k1_scalar_set_b32((secp256k1_scalar *)r,auStack_40,&iStack_44);
    } while (iStack_44 != 0);
    secp256k1_scalar_verify((secp256k1_scalar *)r);
    auVar5._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
    auVar5._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
    auVar5._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
    auVar5._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
    iVar2 = movmskps(extraout_EAX,auVar5);
  } while (iVar2 == 0xf);
  return;
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 32);
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}